

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall
lan::db::set_bit<double>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,double value)

{
  double *pdVar1;
  string local_58;
  double local_38;
  double value_local;
  string *psStack_28;
  db_bit_type type_local;
  string *name_local;
  db_bit *var_local;
  db_bit *context_local;
  db *this_local;
  
  local_38 = value;
  value_local._4_4_ = type;
  psStack_28 = name;
  name_local = &var->key;
  var_local = context;
  context_local = (db_bit *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  set_bit(this,context,var,&local_58,value_local._4_4_);
  std::__cxx11::string::~string((string *)&local_58);
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = local_38;
  name_local[1]._M_string_length = (size_type)pdVar1;
  return name_local[1]._M_string_length != 0;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }